

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::raise_file_error<std::error_code,char_const*,std::__cxx11::string>
          (_anonymous_namespace_ *this,error_code err,char *message,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path)

{
  ostream *__os;
  error_code erc;
  ostringstream str;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1b8 [2];
  ostringstream local_198 [376];
  
  erc._0_8_ = err._0_8_;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Unable to close",0xf);
  local_1b8[0]._M_string =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT71(local_1b8[0]._M_string._1_7_,0x20);
  __os = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)local_198,(char *)local_1b8,1);
  local_1b8[0]._M_delim = '\"';
  local_1b8[0]._M_escape = '\0';
  local_1b8[0]._M_string =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err._M_cat;
  std::__detail::operator<<(__os,local_1b8);
  std::__cxx11::stringbuf::str();
  erc._M_cat = (error_category *)local_1b8;
  pstore::raise_error_code<std::error_code,std::__cxx11::string>
            ((pstore *)((ulong)this & 0xffffffff),erc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
}

Assistant:

PSTORE_NO_RETURN void raise_file_error (ErrorCode err, MessageStr const message,
                                            PathStr const path) {
        std::ostringstream str;
        str << message << ' ' << pstore::quoted (path);
        pstore::raise_error_code (err, str.str ());
    }